

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

bool __thiscall
metaf::VisibilityGroup::appendVariable
          (VisibilityGroup *this,string *group,IncompleteText nextIfMaxIsInteger,
          IncompleteText nextIfMaxIsFraction)

{
  _Storage<unsigned_int,_true> _Var1;
  bool bVar2;
  long lVar3;
  long lVar4;
  Distance *pDVar5;
  IncompleteText in_ECX;
  IncompleteText in_EDX;
  ulong in_RSI;
  VisibilityGroup *in_RDI;
  bool in_stack_0000001f;
  string *in_stack_00000020;
  optional<metaf::Distance> v;
  optional<metaf::Distance> max;
  optional<metaf::Distance> min;
  bool maxInteger;
  size_type vPos;
  IncompleteText local_e4;
  Distance *in_stack_ffffffffffffff20;
  Distance *in_stack_ffffffffffffff48;
  Distance *in_stack_ffffffffffffff50;
  string local_a0 [64];
  string local_60 [55];
  byte local_29;
  long local_28;
  IncompleteText local_20;
  IncompleteText local_1c;
  ulong local_18;
  
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  lVar3 = std::__cxx11::string::find((char)in_RSI,0x56);
  if (((lVar3 == -1) || (lVar3 == 0)) ||
     (local_28 = lVar3, lVar4 = std::__cxx11::string::length(), lVar3 == lVar4)) {
    return false;
  }
  lVar3 = std::__cxx11::string::find((char)local_18,0x2f);
  local_29 = lVar3 == -1;
  std::__cxx11::string::substr((ulong)local_60,local_18);
  Distance::fromMileString(in_stack_00000020,in_stack_0000001f);
  std::__cxx11::string::~string(local_60);
  bVar2 = std::optional<metaf::Distance>::has_value((optional<metaf::Distance> *)0x244429);
  if (!bVar2) {
    return false;
  }
  std::__cxx11::string::substr((ulong)local_a0,local_18);
  Distance::fromMileString(in_stack_00000020,in_stack_0000001f);
  std::__cxx11::string::~string(local_a0);
  bVar2 = std::optional<metaf::Distance>::has_value((optional<metaf::Distance> *)0x2444b0);
  if (!bVar2) {
    return false;
  }
  bVar2 = Distance::isReported(in_stack_ffffffffffffff20);
  if (bVar2) {
    std::optional<metaf::Distance>::operator*((optional<metaf::Distance> *)0x244510);
    Distance::fromIntegerAndFraction(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    bVar2 = std::optional<metaf::Distance>::has_value((optional<metaf::Distance> *)0x24452c);
    if (!bVar2) {
      return false;
    }
    pDVar5 = std::optional<metaf::Distance>::operator*((optional<metaf::Distance> *)0x244547);
    _Var1 = (pDVar5->dist).super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload;
    (in_RDI->vis).distModifier = pDVar5->distModifier;
    (in_RDI->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_payload = _Var1;
    *(undefined8 *)
     &(in_RDI->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged =
         *(undefined8 *)
          &(pDVar5->dist).super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_engaged;
  }
  else {
    pDVar5 = std::optional<metaf::Distance>::operator*((optional<metaf::Distance> *)0x24456d);
    _Var1 = (pDVar5->dist).super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload;
    (in_RDI->vis).distModifier = pDVar5->distModifier;
    (in_RDI->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_payload = _Var1;
    *(undefined8 *)
     &(in_RDI->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged =
         *(undefined8 *)
          &(pDVar5->dist).super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_engaged;
  }
  pDVar5 = std::optional<metaf::Distance>::operator*((optional<metaf::Distance> *)0x24458e);
  _Var1 = (pDVar5->dist).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload;
  (in_RDI->visMax).distModifier = pDVar5->distModifier;
  (in_RDI->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload = _Var1;
  *(undefined8 *)
   &(in_RDI->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_engaged =
       *(undefined8 *)
        &(pDVar5->dist).super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_engaged;
  makeVariable(in_RDI);
  if ((local_29 & 1) == 0) {
    local_e4 = local_20;
  }
  else {
    local_e4 = local_1c;
  }
  in_RDI->incompleteText = local_e4;
  return true;
}

Assistant:

bool VisibilityGroup::appendVariable(const std::string & group,
	IncompleteText nextIfMaxIsInteger,
	IncompleteText nextIfMaxIsFraction)
{
	const auto vPos = group.find('V');
	if (vPos == std::string::npos || 
		!vPos ||
		vPos == group.length()) return false;
	const bool maxInteger = (group.find('/', vPos) == std::string::npos);
	const auto min = 
		Distance::fromMileString(group.substr(0, vPos), true);
	if (!min.has_value()) return false;
	const auto max = 
		Distance::fromMileString(group.substr(vPos + 1), true);
	if (!max.has_value()) return false;

	if (vis.isReported()) {
		const auto v = Distance::fromIntegerAndFraction(vis, std::move(*min));
		if (!v.has_value()) return false;
		vis = std::move(*v);
	} else {
		vis = std::move(*min);
	}
	visMax = std::move(*max);
	makeVariable();
	incompleteText = maxInteger ? nextIfMaxIsInteger : nextIfMaxIsFraction;
	return true;
}